

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
ChebTools::ChebyshevExpansion::real_roots_UH
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,ChebyshevExpansion *this,
          bool only_in_domain)

{
  double dVar1;
  iterator __position;
  long lVar2;
  long lVar3;
  ArrayXd real_eigs;
  double x;
  void *local_80;
  long local_78;
  MatrixXd local_70;
  void *local_58 [2];
  MatrixXd local_48;
  MatrixXd *local_30;
  
  companion_matrix(&local_48,this,&this->m_c);
  local_30 = &local_48;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_70,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_30);
  eigenvalues_upperHessenberg((ChebTools *)local_58,&local_70,true);
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_80,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_58);
  free(local_58[0]);
  free(local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < local_78) {
    lVar3 = 0;
    lVar2 = local_78;
    do {
      dVar1 = *(double *)((long)local_80 + lVar3 * 8);
      if ((!only_in_domain) || (ABS(dVar1) <= 1.0)) {
        local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
             (double *)(((this->m_xmax - this->m_xmin) * dVar1 + this->m_xmax + this->m_xmin) * 0.5)
        ;
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                     (double *)&local_70);
          lVar2 = local_78;
        }
        else {
          *__position._M_current =
               (double)local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < lVar2);
  }
  free(local_80);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> ChebyshevExpansion::real_roots_UH(bool only_in_domain) const {
        // The companion matrix is definitely lower Hessenberg, so we can skip the Hessenberg
        // decomposition, and get the real eigenvalues directly.  These eigenvalues are defined
        // in the domain [-1, 1], but it might also include values outside [-1, 1]
        Eigen::ArrayXd real_eigs = eigenvalues_upperHessenberg(companion_matrix(coef()).transpose(), /* balance = */ true);
        
        
        
        std::vector<double> roots;
        for (Eigen::Index i = 0; i < real_eigs.size(); ++i){
            double val_n11 = real_eigs(i);
            const bool is_in_domain = (val_n11 >= -1.0 && val_n11 <= 1.0);
            // Keep it if it is in domain, or if you just want all real roots
            if (!only_in_domain || is_in_domain){
                // Rescale back into real-world values in [xmin,xmax] from [-1,1]
                double x = ((m_xmax - m_xmin)*val_n11 + (m_xmax + m_xmin)) / 2.0;
                roots.push_back(x);
            }
        }
        return roots;
    }